

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

float __thiscall
tcu::Texture2DArrayView::sampleCompareOffset
          (Texture2DArrayView *this,Sampler *sampler,float ref,float s,float t,float r,float lod,
          IVec2 *offset)

{
  int numLevels;
  ConstPixelBufferAccess *levels;
  int x_;
  int y_;
  int z_;
  float fVar1;
  Vector<int,_3> local_44;
  Vector<int,_2> *local_38;
  IVec2 *offset_local;
  float local_28;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  float ref_local;
  Sampler *sampler_local;
  Texture2DArrayView *this_local;
  
  levels = this->m_levels;
  numLevels = this->m_numLevels;
  local_38 = offset;
  offset_local._4_4_ = lod;
  local_28 = r;
  lod_local = t;
  r_local = s;
  t_local = ref;
  _s_local = sampler;
  sampler_local = (Sampler *)this;
  x_ = Vector<int,_2>::x(offset);
  y_ = Vector<int,_2>::y(local_38);
  z_ = selectLayer(this,local_28);
  Vector<int,_3>::Vector(&local_44,x_,y_,z_);
  fVar1 = sampleLevelArray2DCompare(levels,numLevels,sampler,ref,s,t,lod,&local_44);
  return fVar1;
}

Assistant:

float Texture2DArrayView::sampleCompareOffset (const Sampler& sampler, float ref, float s, float t, float r, float lod, const IVec2& offset) const
{
	return sampleLevelArray2DCompare(m_levels, m_numLevels, sampler, ref, s, t, lod, IVec3(offset.x(), offset.y(), selectLayer(r)));
}